

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits)

{
  Result RVar1;
  Enum EVar2;
  value_type local_60;
  MemoryDesc local_38;
  
  RVar1 = SharedValidator::OnMemory
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     limits);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    local_60.limits.initial = limits->initial;
    local_60.limits.max = limits->max;
    local_60.super_ExternType.kind = Memory;
    local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0920;
    local_60.limits.has_max = limits->has_max;
    local_60.limits.is_shared = limits->is_shared;
    local_60.limits._18_2_ = *(undefined2 *)&limits->field_0x12;
    local_60.limits._21_3_ = SUB43((uint)*(undefined4 *)&limits->field_0x14 >> 8,0);
    local_60.limits._20_1_ = SUB41((uint)*(undefined4 *)&limits->is_shared >> 0x18,0);
    if ((limits->has_max & 1U) == 0) {
      local_60.limits.max = 0x10000;
    }
    local_38.type.super_ExternType.kind = Memory;
    local_38.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0920;
    local_38.type.limits.max = local_60.limits.max;
    local_38.type.limits._20_4_ = local_60.limits._20_4_;
    local_38.type.limits.has_max = local_60.limits.has_max;
    local_38.type.limits.is_shared = local_60.limits.is_shared;
    local_38.type.limits._18_2_ = local_60.limits._18_2_;
    local_38.type.limits.initial = local_60.limits.initial;
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
    emplace_back<wabt::interp::MemoryDesc>(&this->module_->memories,&local_38);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,&local_60);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index, const Limits* limits) {
  CHECK_RESULT(validator_.OnMemory(loc, *limits));
  MemoryType memory_type{*limits};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}